

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDisplayNode.h
# Opt level: O0

ostream * MinVR::operator<<(ostream *os,VRDisplayNode *p)

{
  ostream *poVar1;
  ostream *in_RDI;
  string *unaff_retaddr;
  VRDisplayNode *in_stack_00000008;
  allocator<char> local_51;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  VRDisplayNode::printNode(in_stack_00000008,unaff_retaddr);
  poVar1 = std::operator<<(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
  std::allocator<char>::~allocator(&local_51);
  return poVar1;
}

Assistant:

std::ostream & operator<<(std::ostream &os, const VRDisplayNode& p) {
    return os << p.printNode("");
  }